

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O1

void Gia_ManMuxProfiling(Gia_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  int *piVar2;
  Gia_Obj_t *pGVar3;
  uint *puVar4;
  Gia_Man_t *pGVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  Gia_Man_t *pGia;
  Mux_Man_t *p_00;
  Vec_Str_t *vStr;
  char *pcVar11;
  Vec_Int_t *pVVar12;
  Vec_Wec_t *pVVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  bool bVar17;
  int fFound;
  timespec ts;
  int local_5c;
  long local_58;
  Mux_Man_t *local_50;
  timespec local_48;
  Gia_Man_t *local_38;
  
  iVar6 = clock_gettime(3,&local_48);
  if (iVar6 < 0) {
    lVar14 = 1;
  }
  else {
    lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar14 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  pGia = Gia_ManDupMuxes(p,2);
  uVar10 = pGia->nObjs;
  if (1 < uVar10) {
    uVar8 = 0;
    uVar7 = uVar10 - 1;
    uVar10 = uVar8;
    if (uVar7 != 0) {
      do {
        uVar10 = uVar8 + 1;
        bVar17 = 9 < uVar7;
        uVar8 = uVar10;
        uVar7 = uVar7 / 10;
      } while (bVar17);
    }
  }
  p_00 = Mux_ManAlloc(pGia);
  Gia_ManLevelNum(pGia);
  Gia_ManCreateRefs(pGia);
  pVVar12 = pGia->vCos;
  if (0 < pVVar12->nSize) {
    piVar2 = pVVar12->pArray;
    lVar15 = 0;
    do {
      iVar6 = piVar2[lVar15];
      if (((long)iVar6 < 0) || (pGia->nObjs <= iVar6)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar3 = pGia->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar1 = pGVar3 + iVar6 + -(ulong)((uint)*(undefined8 *)(pGVar3 + iVar6) & 0x1fffffff);
      if ((pGVar1 < pGVar3) || (pGVar3 + pGia->nObjs <= pGVar1)) {
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      pGia->pRefs[(int)((ulong)((long)pGVar1 - (long)pGVar3) >> 2) * -0x55555555] =
           pGia->pRefs[(int)((ulong)((long)pGVar1 - (long)pGVar3) >> 2) * -0x55555555] + 1;
      lVar15 = lVar15 + 1;
    } while (lVar15 < pVVar12->nSize);
  }
  local_58 = lVar14;
  local_38 = p;
  vStr = (Vec_Str_t *)malloc(0x10);
  vStr->nCap = 1000;
  vStr->nSize = 0;
  pcVar11 = (char *)malloc(1000);
  vStr->pArray = pcVar11;
  pVVar12 = Gia_ManFirstFanouts(pGia);
  local_50 = p_00;
  if (0 < pGia->nObjs) {
    lVar14 = 0;
    do {
      if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
      puVar4 = pGia->pMuxes;
      if ((puVar4 != (uint *)0x0) && (puVar4[lVar14] != 0)) {
        if (pGia->pRefs[lVar14] == 1) {
          if (pVVar12->nSize <= lVar14) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          if ((puVar4 != (uint *)0x0) && (puVar4[pVVar12->pArray[lVar14]] != 0)) goto LAB_007294db;
        }
        iVar6 = Gia_MuxStructDump(pGia,(int)lVar14,vStr,3,uVar10);
        if (iVar6 != 1) {
          uVar8 = Abc_NamStrFindOrAdd(p_00->pNames,vStr->pArray,&local_5c);
          if (local_5c == 0) {
            Vec_WecPushLevel(p_00->vTops);
          }
          iVar9 = Abc_NamObjNumMax(p_00->pNames);
          iVar6 = p_00->vTops->nSize;
          if (iVar9 != iVar6) {
            __assert_fail("Abc_NamObjNumMax(pMan->pNames) == Vec_WecSize(pMan->vTops)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaMuxes.c"
                          ,0x224,"void Gia_ManMuxProfiling(Gia_Man_t *)");
          }
          if (((int)uVar8 < 0) || (iVar6 <= (int)uVar8)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                          ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
          }
          Vec_IntPush(p_00->vTops->pArray + uVar8,(int)lVar14);
          p_00 = local_50;
        }
      }
LAB_007294db:
      lVar14 = lVar14 + 1;
    } while (lVar14 < pGia->nObjs);
  }
  if (vStr->pArray != (char *)0x0) {
    free(vStr->pArray);
    vStr->pArray = (char *)0x0;
  }
  free(vStr);
  pGVar5 = local_38;
  if (pVVar12->pArray != (int *)0x0) {
    free(pVVar12->pArray);
    pVVar12->pArray = (int *)0x0;
  }
  if (pVVar12 != (Vec_Int_t *)0x0) {
    free(pVVar12);
  }
  uVar8 = 0;
  printf("MUX structure profile for AIG \"%s\":\n",pGVar5->pName);
  uVar10 = pGia->nMuxes;
  iVar6 = p_00->vTops->nSize;
  if (0 < (long)iVar6) {
    lVar14 = 0;
    uVar8 = 0;
    do {
      uVar8 = uVar8 + *(int *)((long)&p_00->vTops->pArray->nSize + lVar14);
      lVar14 = lVar14 + 0x10;
    } while ((long)iVar6 << 4 != lVar14);
  }
  iVar9 = Abc_NamMemUsed(p_00->pNames);
  printf("Total MUXes = %d.  Total trees = %d.  Unique trees = %d.  Memory = %.2f MB   ",
         (double)iVar9 * 9.5367431640625e-07,(ulong)uVar10,(ulong)uVar8,(ulong)(iVar6 - 1));
  iVar9 = 3;
  iVar6 = clock_gettime(3,&local_48);
  if (iVar6 < 0) {
    lVar14 = -1;
  }
  else {
    lVar14 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
  }
  lVar14 = lVar14 + local_58;
  Abc_Print(iVar9,"%s =","Time");
  Abc_Print(iVar9,"%9.2f sec\n",(double)lVar14 / 1000000.0);
  iVar6 = Gia_ManMuxProfile(p_00,0);
  if (iVar6 != 0) {
    Gia_ManMuxProfile(p_00,1);
    printf("The first %d structures: \n",10);
    pVVar13 = p_00->vTops;
    if (1 < pVVar13->nSize) {
      uVar16 = 1;
      lVar14 = 0x14;
      do {
        pVVar12 = pVVar13->pArray;
        pcVar11 = Abc_NamStr(p_00->pNames,(int)uVar16);
        printf("%5d : ",uVar16 & 0xffffffff);
        printf("Occur = %4d   ",(ulong)*(uint *)((long)&pVVar12->nCap + lVar14));
        uVar10 = atoi(pcVar11);
        printf("Size = %4d   ",(ulong)uVar10);
        puts(pcVar11);
        uVar16 = uVar16 + 1;
        pVVar13 = p_00->vTops;
        iVar6 = pVVar13->nSize;
        if (9 < iVar6) {
          iVar6 = 10;
        }
        lVar14 = lVar14 + 0x10;
      } while ((long)uVar16 < (long)iVar6);
    }
    pVVar13 = p_00->vTops;
    if (1 < pVVar13->nSize) {
      uVar16 = 1;
      iVar6 = 0;
      do {
        pVVar12 = pVVar13->pArray;
        pcVar11 = Abc_NamStr(p_00->pNames,(int)uVar16);
        uVar10 = pVVar12[uVar16].nSize;
        bVar17 = true;
        if ((5 < (int)uVar10) && (uVar8 = atoi(pcVar11), 5 < (int)uVar8)) {
          printf("For example, structure %d has %d MUXes and bit-width %d:\n",uVar16 & 0xffffffff,
                 (ulong)uVar8,(ulong)uVar10);
          if (0 < pVVar12[uVar16].nSize) {
            lVar14 = 0;
            do {
              Gia_MuxStructPrint(pGia,pVVar12[uVar16].pArray[lVar14]);
              lVar14 = lVar14 + 1;
            } while (lVar14 < pVVar12[uVar16].nSize);
          }
          iVar6 = iVar6 + 1;
          bVar17 = iVar6 != 5;
        }
        p_00 = local_50;
        if (!bVar17) break;
        uVar16 = uVar16 + 1;
        pVVar13 = local_50->vTops;
      } while ((long)uVar16 < (long)pVVar13->nSize);
    }
  }
  Mux_ManFree(p_00);
  Gia_ManStop(pGia);
  return;
}

Assistant:

void Gia_ManMuxProfiling( Gia_Man_t * p )
{
    Mux_Man_t * pMan;
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    Vec_Str_t * vStr;
    Vec_Int_t * vFans, * vVec;
    int i, Counter, fFound, iStructId, nDigitsId;
    abctime clk = Abc_Clock();

    pNew = Gia_ManDupMuxes( p, 2 );
    nDigitsId = Abc_Base10Log( Gia_ManObjNum(pNew) );

    pMan = Mux_ManAlloc( pNew );
     
    Gia_ManLevelNum( pNew );
    Gia_ManCreateRefs( pNew );
    Gia_ManForEachCo( pNew, pObj, i )
        Gia_ObjRefFanin0Inc( pNew, pObj );

    vStr = Vec_StrAlloc( 1000 );
    vFans = Gia_ManFirstFanouts( pNew );
    Gia_ManForEachMux( pNew, pObj, i )
    {
        // skip MUXes in the middle of the tree (which have only one MUX fanout)
        if ( Gia_ObjRefNumId(pNew, i) == 1 && Gia_ObjIsMuxId(pNew, Vec_IntEntry(vFans, i)) )
            continue;
        // this node is the root of the MUX structure - create hash key
        Counter = Gia_MuxStructDump( pNew, i, vStr, 3, nDigitsId );
        if ( Counter == 1 )
            continue;
        iStructId = Abc_NamStrFindOrAdd( pMan->pNames, Vec_StrArray(vStr), &fFound );
        if ( !fFound )
            Vec_WecPushLevel( pMan->vTops );
        assert( Abc_NamObjNumMax(pMan->pNames) == Vec_WecSize(pMan->vTops) );
        Vec_IntPush( Vec_WecEntry(pMan->vTops, iStructId), i );
    }
    Vec_StrFree( vStr );
    Vec_IntFree( vFans );

    printf( "MUX structure profile for AIG \"%s\":\n", p->pName );
    printf( "Total MUXes = %d.  Total trees = %d.  Unique trees = %d.  Memory = %.2f MB   ", 
        Gia_ManMuxNum(pNew), Vec_WecSizeSize(pMan->vTops), Vec_WecSize(pMan->vTops)-1, 
        1.0*Abc_NamMemUsed(pMan->pNames)/(1<<20) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    if ( Gia_ManMuxProfile(pMan, 0) )
    {
        Gia_ManMuxProfile( pMan, 1 );

        // short the first ones
        printf( "The first %d structures: \n", 10 );
        Vec_WecForEachLevelStartStop( pMan->vTops, vVec, i, 1, Abc_MinInt(Vec_WecSize(pMan->vTops), 10) )
        {
            char * pTemp = Abc_NamStr(pMan->pNames, i);
            printf( "%5d : ", i );
            printf( "Occur = %4d   ", Vec_IntSize(vVec) );
            printf( "Size = %4d   ", atoi(pTemp) );
            printf( "%s\n", pTemp );
        }

        // print trees for the first one
        Counter = 0;
        Vec_WecForEachLevelStart( pMan->vTops, vVec, i, 1 )
        {
            char * pTemp = Abc_NamStr(pMan->pNames, i);
            if ( Vec_IntSize(vVec) > 5 && atoi(pTemp) > 5 )
            {
                int k, Entry;
                printf( "For example, structure %d has %d MUXes and bit-width %d:\n", i, atoi(pTemp), Vec_IntSize(vVec) );
                Vec_IntForEachEntry( vVec, Entry, k )
                    Gia_MuxStructPrint( pNew, Entry );
                if ( ++Counter == 5 )
                    break;
            }
        }
    }

    Mux_ManFree( pMan );
    Gia_ManStop( pNew );
}